

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppfVar1;
  pointer *ppPVar2;
  char *__s;
  pointer piVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  size_t sVar6;
  QueuePolicy *q_policy;
  vector<PointT,_std::allocator<PointT>_> *this;
  RegularLink<diy::Bounds<float>_> *this_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  bool help;
  _List_node_base *local_1af0;
  _List_node_base *local_1ae8;
  _List_node_base *local_1ae0;
  _List_node_base *local_1ad8;
  int bins;
  int nblocks;
  vector<int,_std::allocator<int>_> gids;
  ContiguousAssigner cuts_assigner;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a90;
  vector<PointT,_std::allocator<PointT>_> points;
  string local_1a60;
  communicator comm;
  _Any_data local_1a28;
  code *local_1a18;
  code *local_1a10;
  _Any_data local_1a08;
  code *local_19f8;
  code *local_19f0;
  vector<PointT,_std::allocator<PointT>_> local_19e0;
  Options ops;
  environment env;
  _Any_data local_1988;
  code *local_1978;
  undefined8 uStack_1970;
  _Any_data local_1968;
  code *local_1958;
  undefined8 uStack_1950;
  string local_1940;
  string local_1920;
  communicator local_1900;
  ContinuousBounds gdomain;
  char filename [512];
  Master master;
  
  filename._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(filename,&master,1);
  comm.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  comm.rank_ = 0;
  comm.size_ = 1;
  comm.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(comm.comm_.data);
  nblocks = 1;
  bins = 0x80;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"blocks","");
  ppfVar1 = &gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_end;
  gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>._0_8_ = ppfVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gdomain,"number of blocks","");
  opts::Option<int>((opts *)&local_1ad8,'b',(string *)&master,&nblocks,(string *)&gdomain);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = local_1ad8;
  local_1ad8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppPVar2 = &points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&points,"filename","");
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gids,"csv of points","");
  opts::Option<char[512]>((opts *)&local_1ae0,'f',(string *)&points,&filename,(string *)&gids);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = local_1ae0;
  local_1ae0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  cuts_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner = (_func_int **)&local_1a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cuts_assigner,"bins","");
  local_1a60._M_dataplus._M_p = (pointer)&local_1a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a60,"number of bins","");
  opts::Option<int>((opts *)&local_1ae8,'n',(string *)&cuts_assigner,&bins,&local_1a60);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = local_1ae8;
  local_1ae8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1920._M_dataplus._M_p = (pointer)&local_1920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1920,"help","");
  local_1940._M_dataplus._M_p = (pointer)&local_1940.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1940,"show help","");
  opts::Option<bool>((opts *)&local_1af0,'h',&local_1920,&help,&local_1940);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = local_1af0;
  local_1af0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1af0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1af0 + 8))();
  }
  local_1af0 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1940._M_dataplus._M_p != &local_1940.field_2) {
    operator_delete(local_1940._M_dataplus._M_p,local_1940.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1920._M_dataplus._M_p != &local_1920.field_2) {
    operator_delete(local_1920._M_dataplus._M_p,local_1920.field_2._M_allocated_capacity + 1);
  }
  if (local_1ae8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1ae8 + 8))();
  }
  local_1ae8 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a60._M_dataplus._M_p != &local_1a60.field_2) {
    operator_delete(local_1a60._M_dataplus._M_p,local_1a60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cuts_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner != &local_1a90) {
    operator_delete(cuts_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner,
                    local_1a90._M_allocated_capacity + 1);
  }
  if (local_1ae0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1ae0 + 8))();
  }
  local_1ae0 = (_List_node_base *)0x0;
  if ((pointer *)
      gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      &gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppPVar2) {
    operator_delete(points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)(points.super__Vector_base<PointT,_std::allocator<PointT>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage)->coords + 1));
  }
  if (local_1ad8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1ad8 + 8))();
  }
  local_1ad8 = (_List_node_base *)0x0;
  if ((pointer *)gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>._0_8_ !=
      ppfVar1) {
    operator_delete((void *)gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                            _0_8_,
                    (long)gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                          m_end + 1);
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar4 = opts::Options::parse(&ops,argc,argv);
  if ((bVar4) && (help != true)) {
    local_1900.comm_.data = comm.comm_.data;
    local_1900.rank_ = comm.rank_;
    local_1900.size_ = comm.size_;
    local_1900.owner_ = false;
    local_1a08._M_unused._M_object = (void *)0x0;
    local_1a08._8_8_ = 0;
    local_19f0 = std::
                 _Function_handler<void_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:123:35)>
                 ::_M_invoke;
    local_19f8 = std::
                 _Function_handler<void_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:123:35)>
                 ::_M_manager;
    local_1a28._M_unused._M_object = (void *)0x0;
    local_1a28._8_8_ = 0;
    local_1a10 = std::
                 _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:124:5)>
                 ::_M_invoke;
    local_1a18 = std::
                 _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:124:5)>
                 ::_M_manager;
    local_1968._M_unused._M_object = (void *)0x0;
    local_1968._8_8_ = 0;
    local_1958 = (code *)0x0;
    uStack_1950 = 0;
    local_1978 = (code *)0x0;
    uStack_1970 = 0;
    local_1988._M_unused._M_object = (void *)0x0;
    local_1988._8_8_ = 0;
    q_policy = (QueuePolicy *)operator_new(0x10);
    q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0014f210;
    q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&master,&local_1900,1,-1,(CreateBlock *)&local_1a08,
                        (DestroyBlock *)&local_1a28,(ExternalStorage *)0x0,(SaveBlock *)&local_1968,
                        (LoadBlock *)&local_1988,q_policy);
    if (local_1978 != (code *)0x0) {
      (*local_1978)(&local_1988,&local_1988,__destroy_functor);
    }
    if (local_1958 != (code *)0x0) {
      (*local_1958)(&local_1968,&local_1968,__destroy_functor);
    }
    if (local_1a18 != (code *)0x0) {
      (*local_1a18)(&local_1a28,&local_1a28,__destroy_functor);
    }
    if (local_19f8 != (code *)0x0) {
      (*local_19f8)(&local_1a08,&local_1a08,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_1900);
    cuts_assigner.super_StaticAssigner.super_Assigner.size_ = comm.size_;
    cuts_assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
    cuts_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014f3b8;
    read_csv(&points,filename);
    std::vector<PointT,_std::allocator<PointT>_>::vector(&local_19e0,&points);
    compute_bounds(&gdomain,&local_19e0);
    if (local_19e0.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_19e0.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_19e0.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_19e0.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar10 = cuts_assigner.super_StaticAssigner.super_Assigner.nblocks_ /
             cuts_assigner.super_StaticAssigner.super_Assigner.size_;
    iVar8 = cuts_assigner.super_StaticAssigner.super_Assigner.nblocks_ %
            cuts_assigner.super_StaticAssigner.super_Assigner.size_;
    iVar9 = iVar10 + 1;
    if (comm.rank_ < iVar8) {
      iVar7 = iVar9 * comm.rank_;
    }
    else {
      iVar7 = (comm.rank_ - iVar8) * iVar10 + iVar8 * iVar9;
    }
    iVar11 = comm.rank_ + 1;
    if (iVar11 < iVar8) {
      iVar9 = iVar9 * iVar11;
    }
    else {
      iVar9 = (iVar11 - iVar8) * iVar10 + iVar8 * iVar9;
    }
    local_1a60._M_dataplus._M_p._0_4_ = iVar7;
    if (iVar7 < iVar9) {
      do {
        if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&gids,
                     (iterator)
                     gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_1a60);
        }
        else {
          *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar7;
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar7 = (int)local_1a60._M_dataplus._M_p + 1;
        local_1a60._M_dataplus._M_p._0_4_ = iVar7;
      } while (iVar7 < iVar9);
    }
    piVar3 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      piVar12 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        iVar10 = *piVar12;
        this = (vector<PointT,_std::allocator<PointT>_> *)operator_new(0x18);
        (this->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (iVar10 == *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          std::vector<PointT,_std::allocator<PointT>_>::operator=(this,&points);
        }
        this_00 = (RegularLink<diy::Bounds<float>_> *)operator_new(0x1b8);
        diy::RegularLink<diy::Bounds<float>_>::RegularLink(this_00,3,&gdomain,&gdomain);
        diy::Master::add(&master,iVar10,this,(Link *)this_00);
        piVar12 = piVar12 + 1;
      } while (piVar12 != piVar3);
    }
    diy::kdtree<BlockT,PointT>(&master,(Assigner *)&cuts_assigner,3,&gdomain,0,(long)bins,false);
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    gdomain.max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_end =
         gdomain.max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    if (gdomain.max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(gdomain.max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                      m_dynamic_data,
                      gdomain.max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                      m_dynamic_capacity << 2);
    }
    gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_end =
         gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    if (gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                      m_dynamic_data,
                      gdomain.min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                      m_dynamic_capacity << 2);
    }
    if (points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)points.super__Vector_base<PointT,_std::allocator<PointT>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    diy::Master::~Master(&master);
    iVar10 = 0;
  }
  else {
    iVar10 = 1;
    if (comm.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *argv;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x151318);
      }
      else {
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Tests Kd tree with dataset where most points are located very closely.\n",0x47);
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  diy::mpi::communicator::~communicator(&comm);
  MPI_Finalize();
  return iVar10;
}

Assistant:

int main (int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator comm;

  bool help;
  int nblocks = 1;
  int bins = 128;
  char filename[512];

  // get command line arguments
  using namespace opts;
  Options ops;
  ops
    >> Option('b', "blocks",    nblocks,        "number of blocks")
    >> Option('f', "filename",  filename,       "csv of points")
    >> Option('n', "bins",      bins,           "number of bins")
    >> Option('h', "help",      help,           "show help")
    ;

  if (!ops.parse(argc,argv) || help)
  {
    if (comm.rank() == 0)
    {
      std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
      std::cout << "Tests Kd tree with dataset where most points are located very closely.\n";
      std::cout << ops;
    }
    return 1;
  }

  diy::Master master(comm, 1, -1, []() { return static_cast<void*>(new BlockT); },
    [](void* b) { delete static_cast<BlockT*>(b); });

  diy::ContiguousAssigner cuts_assigner(comm.size(), nblocks);

  auto points = read_csv(filename);

  const auto gdomain = compute_bounds(points);

  std::vector<int> gids;
  cuts_assigner.local_gids(comm.rank(), gids);
  for (const int gid : gids)
  {
    auto block = new BlockT();
    if (gid == gids[0])
    {
      block->AddPoints(std::move(points));
    }
    auto link = new diy::RegularContinuousLink(3, gdomain, gdomain);
    master.add(gid, block, link);
  }

  diy::kdtree(master, cuts_assigner, 3, gdomain, &BlockT::Points, bins);

  return 0;
}